

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Skeleton::setSelection(Skeleton *this,int pickID,Selection *selection)

{
  bool bVar1;
  mapped_type *ppJVar2;
  _Self local_30;
  _Self local_28;
  Selection *local_20;
  Selection *selection_local;
  Skeleton *pSStack_10;
  int pickID_local;
  Skeleton *this_local;
  
  local_20 = selection;
  selection_local._4_4_ = pickID;
  pSStack_10 = this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
       ::find(&this->idToJoint,(key_type_conflict *)((long)&selection_local + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
       ::end(&this->idToJoint);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    Selection::clear(local_20);
    ppJVar2 = std::
              map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
              ::operator[](&this->idToJoint,(key_type_conflict *)((long)&selection_local + 4));
    local_20->object = &(*ppJVar2)->super_SceneObject;
  }
  return;
}

Assistant:

void Skeleton::setSelection(int pickID, Selection& selection)
  {
    // Set the selection to the joint specified by the given picking ID;
    // these values were generated in Skeleton::draw_pick.
    if (idToJoint.find(pickID) != idToJoint.end())
    {
      selection.clear();
      selection.object = idToJoint[pickID];
    }
  }